

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

optional<cmGlobalGenerator::FrameworkDescriptor> * __thiscall
cmGlobalGenerator::SplitFrameworkPath
          (optional<cmGlobalGenerator::FrameworkDescriptor> *__return_storage_ptr__,
          cmGlobalGenerator *this,string *path,FrameworkFormat format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string name;
  string libname;
  string ext;
  string local_230;
  FrameworkDescriptor local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_190;
  size_type local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_170;
  pointer local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  string local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  pointer local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  pointer local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  if (SplitFrameworkPath(std::__cxx11::string_const&,cmGlobalGenerator::FrameworkFormat)::
      frameworkPath == '\0') {
    iVar5 = __cxa_guard_acquire(&SplitFrameworkPath(std::__cxx11::string_const&,cmGlobalGenerator::FrameworkFormat)
                                 ::frameworkPath);
    if (iVar5 != 0) {
      SplitFrameworkPath::frameworkPath.regmust = (char *)0x0;
      SplitFrameworkPath::frameworkPath.program = (char *)0x0;
      SplitFrameworkPath::frameworkPath.progsize = 0;
      memset(&SplitFrameworkPath::frameworkPath,0,0x20a);
      cmsys::RegularExpression::compile
                (&SplitFrameworkPath::frameworkPath,
                 "((.+)/)?([^/]+)\\.framework(/Versions/([^/]+))?(/(.+))?$");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&SplitFrameworkPath::frameworkPath,
                   &__dso_handle);
      __cxa_guard_release(&SplitFrameworkPath(std::__cxx11::string_const&,cmGlobalGenerator::FrameworkFormat)
                           ::frameworkPath);
    }
  }
  cmsys::SystemTools::GetFilenameLastExtension(&local_50,path);
  if (local_50._M_string_length == 0) {
LAB_0023a541:
    bVar4 = cmsys::RegularExpression::find
                      (&SplitFrameworkPath::frameworkPath,(path->_M_dataplus)._M_p,
                       &SplitFrameworkPath::frameworkPath.regmatch);
    if (!bVar4) goto LAB_0023a57f;
    if (SplitFrameworkPath::frameworkPath.regmatch.startp[3] == (char *)0x0) {
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      local_230._M_string_length = 0;
      local_230.field_2._M_local_buf[0] = '\0';
    }
    else {
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_230,SplitFrameworkPath::frameworkPath.regmatch.startp[3],
                 SplitFrameworkPath::frameworkPath.regmatch.endp[3]);
    }
    if (SplitFrameworkPath::frameworkPath.regmatch.startp[7] == (char *)0x0) {
      local_210.Directory._M_dataplus._M_p = (pointer)&local_210.Directory.field_2;
      local_210.Directory._M_string_length = 0;
      local_210.Directory.field_2._M_allocated_capacity =
           local_210.Directory.field_2._M_allocated_capacity & 0xffffffffffffff00;
    }
    else {
      local_210.Directory._M_dataplus._M_p = (pointer)&local_210.Directory.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_210,SplitFrameworkPath::frameworkPath.regmatch.startp[7],
                 SplitFrameworkPath::frameworkPath.regmatch.endp[7]);
    }
    cmsys::SystemTools::GetFilenameWithoutExtension(&local_150,&local_210.Directory);
    paVar7 = &local_210.Directory.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210.Directory._M_dataplus._M_p != paVar7) {
      operator_delete(local_210.Directory._M_dataplus._M_p,
                      local_210.Directory.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_string_length ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0 && format == Strict) {
LAB_0023a6a8:
      (__return_storage_ptr__->
      super__Optional_base<cmGlobalGenerator::FrameworkDescriptor,_false,_false>)._M_payload.
      super__Optional_payload<cmGlobalGenerator::FrameworkDescriptor,_true,_false,_false>.
      super__Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>._M_engaged = false;
    }
    else {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_string_length !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        local_210.Directory._M_dataplus._M_p = (pointer)local_150._M_string_length;
        local_210.Directory._M_string_length = (size_type)local_150._M_dataplus._M_p;
        __str._M_str = local_230._M_dataplus._M_p;
        __str._M_len = local_230._M_string_length;
        iVar5 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)&local_210,0,
                           local_230._M_string_length,__str);
        if (iVar5 != 0) goto LAB_0023a6a8;
        if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_150._M_string_length ==
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0) || (local_230._M_string_length == local_150._M_string_length))
        goto LAB_0023a919;
        if (SplitFrameworkPath::frameworkPath.regmatch.startp[2] == (char *)0x0) {
          local_d0 = &local_c0;
          local_c8 = (pointer)0x0;
          local_c0._M_local_buf[0] = '\0';
        }
        else {
          local_d0 = &local_c0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d0,SplitFrameworkPath::frameworkPath.regmatch.startp[2],
                     SplitFrameworkPath::frameworkPath.regmatch.endp[2]);
        }
        local_190 = &local_180;
        if (SplitFrameworkPath::frameworkPath.regmatch.startp[5] == (char *)0x0) {
          local_188 = 0;
          local_180._M_local_buf[0] = '\0';
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_190,SplitFrameworkPath::frameworkPath.regmatch.startp[5],
                     SplitFrameworkPath::frameworkPath.regmatch.endp[5]);
        }
        local_70 = &local_60;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,local_230._M_dataplus._M_p,
                   (undefined1 *)(local_230._M_string_length + (long)local_230._M_dataplus._M_p));
        std::__cxx11::string::substr((ulong)&local_b0,(ulong)&local_150);
        if (local_d0 == &local_c0) {
          local_210.Directory.field_2._8_8_ = local_c0._8_8_;
          local_210.Directory._M_dataplus._M_p = (pointer)paVar7;
        }
        else {
          local_210.Directory._M_dataplus._M_p = (pointer)local_d0;
        }
        local_210.Directory.field_2._M_allocated_capacity._1_7_ =
             local_c0._M_allocated_capacity._1_7_;
        local_210.Directory.field_2._M_local_buf[0] = local_c0._M_local_buf[0];
        paVar1 = &local_210.Version.field_2;
        local_210.Directory._M_string_length = (size_type)local_c8;
        local_c8 = (pointer)0x0;
        local_c0._M_local_buf[0] = '\0';
        if (local_190 == &local_180) {
          local_210.Version.field_2._8_8_ = local_180._8_8_;
          local_210.Version._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_210.Version._M_dataplus._M_p = (pointer)local_190;
        }
        local_210.Version.field_2._M_allocated_capacity._1_7_ =
             local_180._M_allocated_capacity._1_7_;
        local_210.Version.field_2._M_local_buf[0] = local_180._M_local_buf[0];
        paVar2 = &local_210.Name.field_2;
        local_210.Version._M_string_length = local_188;
        local_188 = 0;
        local_180._M_local_buf[0] = '\0';
        if (local_70 == &local_60) {
          local_210.Name.field_2._8_8_ = local_60._8_8_;
          local_210.Name._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_210.Name._M_dataplus._M_p = (pointer)local_70;
        }
        local_210.Name.field_2._M_allocated_capacity._1_7_ = local_60._M_allocated_capacity._1_7_;
        local_210.Name.field_2._M_local_buf[0] = local_60._M_local_buf[0];
        paVar3 = &local_210.Suffix.field_2;
        local_210.Name._M_string_length = local_68;
        local_68 = 0;
        local_60._M_local_buf[0] = '\0';
        if (local_b0 == &local_a0) {
          local_210.Suffix.field_2._8_8_ = local_a0._8_8_;
          local_210.Suffix._M_dataplus._M_p = (pointer)paVar3;
        }
        else {
          local_210.Suffix._M_dataplus._M_p = (pointer)local_b0;
        }
        local_210.Suffix.field_2._M_allocated_capacity._1_7_ = local_a0._M_allocated_capacity._1_7_;
        local_210.Suffix.field_2._M_local_buf[0] = local_a0._M_local_buf[0];
        local_210.Suffix._M_string_length = local_a8;
        local_a8 = 0;
        local_a0._M_local_buf[0] = '\0';
        local_190 = &local_180;
        local_d0 = &local_c0;
        local_b0 = &local_a0;
        local_70 = &local_60;
        FrameworkDescriptor::FrameworkDescriptor
                  ((FrameworkDescriptor *)__return_storage_ptr__,&local_210);
        (__return_storage_ptr__->
        super__Optional_base<cmGlobalGenerator::FrameworkDescriptor,_false,_false>)._M_payload.
        super__Optional_payload<cmGlobalGenerator::FrameworkDescriptor,_true,_false,_false>.
        super__Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>._M_engaged = true;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210.Suffix._M_dataplus._M_p != paVar3) {
          operator_delete(local_210.Suffix._M_dataplus._M_p,
                          local_210.Suffix.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210.Name._M_dataplus._M_p != paVar2) {
          operator_delete(local_210.Name._M_dataplus._M_p,
                          local_210.Name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210.Version._M_dataplus._M_p != paVar1) {
          operator_delete(local_210.Version._M_dataplus._M_p,
                          local_210.Version.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210.Directory._M_dataplus._M_p != paVar7) {
          operator_delete(local_210.Directory._M_dataplus._M_p,
                          local_210.Directory.field_2._M_allocated_capacity + 1);
        }
        if (local_b0 != &local_a0) {
          operator_delete(local_b0,CONCAT71(local_a0._M_allocated_capacity._1_7_,
                                            local_a0._M_local_buf[0]) + 1);
        }
        if (local_70 != &local_60) {
          operator_delete(local_70,CONCAT71(local_60._M_allocated_capacity._1_7_,
                                            local_60._M_local_buf[0]) + 1);
        }
        if (local_190 != &local_180) {
          operator_delete(local_190,
                          CONCAT71(local_180._M_allocated_capacity._1_7_,local_180._M_local_buf[0])
                          + 1);
        }
        if (local_d0 != &local_c0) {
          lVar6 = CONCAT71(local_c0._M_allocated_capacity._1_7_,local_c0._M_local_buf[0]);
          paVar7 = local_d0;
          goto LAB_0023abcc;
        }
        goto LAB_0023abd4;
      }
LAB_0023a919:
      local_170 = &local_160;
      if (SplitFrameworkPath::frameworkPath.regmatch.startp[2] == (char *)0x0) {
        local_168 = (pointer)0x0;
        local_160._M_local_buf[0] = '\0';
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_170,SplitFrameworkPath::frameworkPath.regmatch.startp[2],
                   SplitFrameworkPath::frameworkPath.regmatch.endp[2]);
      }
      local_f0 = &local_e0;
      if (SplitFrameworkPath::frameworkPath.regmatch.startp[5] == (char *)0x0) {
        local_e8 = 0;
        local_e0._M_local_buf[0] = '\0';
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,SplitFrameworkPath::frameworkPath.regmatch.startp[5],
                   SplitFrameworkPath::frameworkPath.regmatch.endp[5]);
      }
      local_110 = &local_100;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,local_230._M_dataplus._M_p,
                 (undefined1 *)(local_230._M_string_length + (long)local_230._M_dataplus._M_p));
      if (local_170 == &local_160) {
        local_210.Directory.field_2._8_8_ = local_160._8_8_;
        local_210.Directory._M_dataplus._M_p = (pointer)paVar7;
      }
      else {
        local_210.Directory._M_dataplus._M_p = (pointer)local_170;
      }
      local_210.Directory.field_2._M_allocated_capacity._1_7_ =
           local_160._M_allocated_capacity._1_7_;
      local_210.Directory.field_2._M_local_buf[0] = local_160._M_local_buf[0];
      paVar1 = &local_210.Version.field_2;
      local_210.Directory._M_string_length = (size_type)local_168;
      local_168 = (pointer)0x0;
      local_160._M_local_buf[0] = '\0';
      if (local_f0 == &local_e0) {
        local_210.Version.field_2._8_8_ = local_e0._8_8_;
        local_210.Version._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_210.Version._M_dataplus._M_p = (pointer)local_f0;
      }
      local_210.Version.field_2._M_allocated_capacity._1_7_ = local_e0._M_allocated_capacity._1_7_;
      local_210.Version.field_2._M_local_buf[0] = local_e0._M_local_buf[0];
      paVar2 = &local_210.Name.field_2;
      local_210.Version._M_string_length = local_e8;
      local_e8 = 0;
      local_e0._M_local_buf[0] = '\0';
      if (local_110 == &local_100) {
        local_210.Name.field_2._8_8_ = local_100._8_8_;
        local_210.Name._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_210.Name._M_dataplus._M_p = (pointer)local_110;
      }
      local_210.Name.field_2._M_allocated_capacity._1_7_ = local_100._M_allocated_capacity._1_7_;
      local_210.Name.field_2._M_local_buf[0] = local_100._M_local_buf[0];
      paVar3 = &local_210.Suffix.field_2;
      local_210.Name._M_string_length = local_108;
      local_108 = 0;
      local_100._M_local_buf[0] = '\0';
      local_210.Suffix._M_string_length = 0;
      local_210.Suffix.field_2._M_allocated_capacity =
           local_210.Suffix.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_210.Suffix._M_dataplus._M_p = (pointer)paVar3;
      local_170 = &local_160;
      local_110 = &local_100;
      local_f0 = &local_e0;
      FrameworkDescriptor::FrameworkDescriptor
                ((FrameworkDescriptor *)__return_storage_ptr__,&local_210);
      (__return_storage_ptr__->
      super__Optional_base<cmGlobalGenerator::FrameworkDescriptor,_false,_false>)._M_payload.
      super__Optional_payload<cmGlobalGenerator::FrameworkDescriptor,_true,_false,_false>.
      super__Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>._M_engaged = true;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210.Suffix._M_dataplus._M_p != paVar3) {
        operator_delete(local_210.Suffix._M_dataplus._M_p,
                        local_210.Suffix.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210.Name._M_dataplus._M_p != paVar2) {
        operator_delete(local_210.Name._M_dataplus._M_p,
                        local_210.Name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210.Version._M_dataplus._M_p != paVar1) {
        operator_delete(local_210.Version._M_dataplus._M_p,
                        local_210.Version.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210.Directory._M_dataplus._M_p != paVar7) {
        operator_delete(local_210.Directory._M_dataplus._M_p,
                        local_210.Directory.field_2._M_allocated_capacity + 1);
      }
      if (local_110 != &local_100) {
        operator_delete(local_110,
                        CONCAT71(local_100._M_allocated_capacity._1_7_,local_100._M_local_buf[0]) +
                        1);
      }
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,CONCAT71(local_e0._M_allocated_capacity._1_7_,
                                          local_e0._M_local_buf[0]) + 1);
      }
      if (local_170 == &local_160) goto LAB_0023abd4;
      lVar6 = CONCAT71(local_160._M_allocated_capacity._1_7_,local_160._M_local_buf[0]);
      paVar7 = local_170;
LAB_0023abcc:
      operator_delete(paVar7,lVar6 + 1);
    }
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar5 == 0) goto LAB_0023a541;
    iVar5 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar5 == 0) goto LAB_0023a541;
LAB_0023a57f:
    if (format != Extended) {
      (__return_storage_ptr__->
      super__Optional_base<cmGlobalGenerator::FrameworkDescriptor,_false,_false>)._M_payload.
      super__Optional_payload<cmGlobalGenerator::FrameworkDescriptor,_true,_false,_false>.
      super__Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>._M_engaged = false;
      goto LAB_0023ac10;
    }
    cmsys::SystemTools::GetParentDirectory(&local_230,path);
    cmsys::SystemTools::GetFilenameLastExtension(&local_210.Directory,path);
    iVar5 = std::__cxx11::string::compare((char *)&local_210);
    if (iVar5 == 0) {
      cmsys::SystemTools::GetFilenameWithoutExtension(&local_150,path);
    }
    else {
      cmsys::SystemTools::GetFilenameName(&local_150,path);
    }
    paVar7 = &local_210.Directory.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210.Directory._M_dataplus._M_p != paVar7) {
      operator_delete(local_210.Directory._M_dataplus._M_p,
                      local_210.Directory.field_2._M_allocated_capacity + 1);
    }
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_230._M_dataplus._M_p,
               (undefined1 *)(local_230._M_string_length + (long)local_230._M_dataplus._M_p));
    local_130 = &local_120;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,local_150._M_dataplus._M_p,
               (char *)(local_150._M_string_length + (long)local_150._M_dataplus._M_p));
    if (local_90 == &local_80) {
      local_210.Directory.field_2._8_8_ = local_80._8_8_;
      local_210.Directory._M_dataplus._M_p = (pointer)paVar7;
    }
    else {
      local_210.Directory._M_dataplus._M_p = (pointer)local_90;
    }
    local_210.Directory.field_2._M_allocated_capacity._1_7_ = local_80._M_allocated_capacity._1_7_;
    local_210.Directory.field_2._M_local_buf[0] = local_80._M_local_buf[0];
    paVar7 = &local_210.Version.field_2;
    local_210.Directory._M_string_length = (size_type)local_88;
    local_88 = (pointer)0x0;
    local_80._M_local_buf[0] = '\0';
    local_210.Version._M_string_length = 0;
    local_210.Version.field_2._M_allocated_capacity =
         local_210.Version.field_2._M_allocated_capacity & 0xffffffffffffff00;
    paVar1 = &local_210.Name.field_2;
    if (local_130 == &local_120) {
      local_210.Name.field_2._8_8_ = local_120._8_8_;
      local_210.Name._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_210.Name._M_dataplus._M_p = (pointer)local_130;
    }
    local_210.Name.field_2._M_allocated_capacity._1_7_ = local_120._M_allocated_capacity._1_7_;
    local_210.Name.field_2._M_local_buf[0] = local_120._M_local_buf[0];
    paVar2 = &local_210.Suffix.field_2;
    local_210.Name._M_string_length = local_128;
    local_128 = 0;
    local_120._M_local_buf[0] = '\0';
    local_210.Suffix._M_string_length = 0;
    local_210.Suffix.field_2._M_allocated_capacity =
         local_210.Suffix.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_210.Version._M_dataplus._M_p = (pointer)paVar7;
    local_210.Suffix._M_dataplus._M_p = (pointer)paVar2;
    local_130 = &local_120;
    local_90 = &local_80;
    FrameworkDescriptor::FrameworkDescriptor
              ((FrameworkDescriptor *)__return_storage_ptr__,&local_210);
    (__return_storage_ptr__->
    super__Optional_base<cmGlobalGenerator::FrameworkDescriptor,_false,_false>)._M_payload.
    super__Optional_payload<cmGlobalGenerator::FrameworkDescriptor,_true,_false,_false>.
    super__Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>._M_engaged = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210.Suffix._M_dataplus._M_p != paVar2) {
      operator_delete(local_210.Suffix._M_dataplus._M_p,
                      local_210.Suffix.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210.Name._M_dataplus._M_p != paVar1) {
      operator_delete(local_210.Name._M_dataplus._M_p,
                      local_210.Name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210.Version._M_dataplus._M_p != paVar7) {
      operator_delete(local_210.Version._M_dataplus._M_p,
                      local_210.Version.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210.Directory._M_dataplus._M_p != &local_210.Directory.field_2) {
      operator_delete(local_210.Directory._M_dataplus._M_p,
                      local_210.Directory.field_2._M_allocated_capacity + 1);
    }
    if (local_130 != &local_120) {
      operator_delete(local_130,
                      CONCAT71(local_120._M_allocated_capacity._1_7_,local_120._M_local_buf[0]) + 1)
      ;
    }
    if (local_90 != &local_80) {
      lVar6 = CONCAT71(local_80._M_allocated_capacity._1_7_,local_80._M_local_buf[0]);
      paVar7 = local_90;
      goto LAB_0023abcc;
    }
  }
LAB_0023abd4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,
                    CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                             local_230.field_2._M_local_buf[0]) + 1);
  }
LAB_0023ac10:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

cm::optional<cmGlobalGenerator::FrameworkDescriptor>
cmGlobalGenerator::SplitFrameworkPath(const std::string& path,
                                      FrameworkFormat format) const
{
  // Check for framework structure:
  //    (/path/to/)?FwName.framework
  // or (/path/to/)?FwName.framework/FwName(.tbd)?
  // or (/path/to/)?FwName.framework/Versions/*/FwName(.tbd)?
  static cmsys::RegularExpression frameworkPath(
    "((.+)/)?([^/]+)\\.framework(/Versions/([^/]+))?(/(.+))?$");

  auto ext = cmSystemTools::GetFilenameLastExtension(path);
  if ((ext.empty() || ext == ".tbd" || ext == ".framework") &&
      frameworkPath.find(path)) {
    auto name = frameworkPath.match(3);
    auto libname =
      cmSystemTools::GetFilenameWithoutExtension(frameworkPath.match(7));
    if (format == FrameworkFormat::Strict && libname.empty()) {
      return cm::nullopt;
    }
    if (!libname.empty() && !cmHasPrefix(libname, name)) {
      return cm::nullopt;
    }

    if (libname.empty() || name.size() == libname.size()) {
      return FrameworkDescriptor{ frameworkPath.match(2),
                                  frameworkPath.match(5), name };
    }

    return FrameworkDescriptor{ frameworkPath.match(2), frameworkPath.match(5),
                                name, libname.substr(name.size()) };
  }

  if (format == FrameworkFormat::Extended) {
    // path format can be more flexible: (/path/to/)?fwName(.framework)?
    auto fwDir = cmSystemTools::GetParentDirectory(path);
    auto name = cmSystemTools::GetFilenameLastExtension(path) == ".framework"
      ? cmSystemTools::GetFilenameWithoutExtension(path)
      : cmSystemTools::GetFilenameName(path);

    return FrameworkDescriptor{ fwDir, name };
  }

  return cm::nullopt;
}